

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O1

DdNode * Cudd_Inequality(DdManager *dd,int N,int c,DdNode **x,DdNode **y)

{
  int *piVar1;
  DdNode *pDVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  long lVar11;
  DdNode *pDVar12;
  int iVar13;
  DdNode *pDVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  bool bVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  DdNode *g;
  ulong uVar27;
  int iVar28;
  bool bVar29;
  bool bVar30;
  int local_110;
  DdNode *local_108;
  DdNode *local_f8;
  
  pDVar2 = dd->one;
  pDVar7 = (DdNode *)((ulong)pDVar2 ^ 1);
  iVar26 = 1 << ((byte)N - 1 & 0x1f);
  if (N < 0) {
LAB_00789124:
    pDVar10 = (DdNode *)0x0;
  }
  else if (N == 0) {
    pDVar10 = pDVar2;
    if (c < 0) {
      pDVar10 = pDVar7;
    }
  }
  else {
    iVar19 = 1 << ((byte)N & 0x1f);
    pDVar10 = pDVar7;
    if ((c < iVar19) && (pDVar10 = pDVar2, 1 - iVar19 < c)) {
      uVar16 = 1;
      uVar27 = 1;
      pDVar10 = (DdNode *)0x0;
      local_108 = (DdNode *)0x0;
      local_f8 = (DdNode *)0x0;
      local_110 = c + -1;
      iVar25 = c;
      iVar19 = iVar26;
      iVar5 = iVar26;
      do {
        iVar17 = c + -1 >> ((byte)uVar27 & 0x1f);
        bVar29 = (uVar16 & c) != 1;
        bVar3 = (byte)uVar27 & 0x1f;
        iVar13 = c >> bVar3;
        uVar20 = (uint)bVar29;
        iVar18 = iVar17 + uVar20;
        bVar22 = iVar18 < iVar13;
        iVar21 = iVar26;
        if (iVar18 < iVar13) {
          pDVar9 = (DdNode *)0x0;
          pDVar14 = (DdNode *)(ulong)(uint)(0 >> bVar3);
          iVar24 = iVar26;
        }
        else {
          lVar11 = (uint)N - uVar27;
          iVar28 = 1 << ((byte)lVar11 & 0x1f);
          iVar15 = iVar13 * 2;
          pDVar14 = (DdNode *)0x0;
          pDVar12 = (DdNode *)0x0;
          iVar4 = iVar13;
          iVar23 = iVar26;
          do {
            pDVar9 = pDVar12;
            iVar24 = iVar23;
            if ((iVar4 < iVar28) && (-iVar28 < iVar4)) {
              pDVar9 = pDVar2;
              if ((iVar15 <= iVar25) && (pDVar9 = pDVar7, local_110 < iVar15 + -1)) {
                if ((iVar19 + 1 != iVar15) && (iVar5 + 1 != iVar15)) {
                  __assert_fail("leftChild == index[0] || leftChild == index[1]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                ,0x331,
                                "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                               );
                }
                pDVar9 = local_f8;
                if (iVar19 + 1 == iVar15) {
                  pDVar9 = local_108;
                }
              }
              g = pDVar2;
              if ((iVar15 < iVar25) && (g = pDVar7, local_110 < iVar15)) {
                if ((iVar19 != iVar15) && (iVar5 != iVar15)) {
                  __assert_fail("middleChild == index[0] || middleChild == index[1]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                ,0x340,
                                "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                               );
                }
                g = local_f8;
                if (iVar19 == iVar15) {
                  g = local_108;
                }
              }
              pDVar8 = pDVar2;
              if ((iVar15 + 1 < iVar25) && (pDVar8 = pDVar7, local_110 <= iVar15)) {
                if ((iVar19 + -1 != iVar15) && (iVar5 + -1 != iVar15)) {
                  __assert_fail("rightChild == index[0] || rightChild == index[1]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                ,0x34f,
                                "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                               );
                }
                pDVar8 = local_f8;
                if (iVar19 + -1 == iVar15) {
                  pDVar8 = local_108;
                }
              }
              pDVar8 = Cudd_bddIte(dd,y[lVar11],g,pDVar8);
              if (pDVar8 == (DdNode *)0x0) {
LAB_00789049:
                if (iVar19 != iVar26) {
                  Cudd_IterDerefBdd(dd,local_108);
                }
                if (iVar5 != iVar26) {
                  Cudd_IterDerefBdd(dd,local_f8);
                }
                if (iVar23 != iVar26) {
                  Cudd_IterDerefBdd(dd,pDVar12);
                }
              }
              else {
                piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                pDVar9 = Cudd_bddIte(dd,y[lVar11],pDVar9,g);
                if (pDVar9 == (DdNode *)0x0) {
                  Cudd_IterDerefBdd(dd,pDVar8);
                  goto LAB_00789049;
                }
                piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                pDVar10 = Cudd_bddIte(dd,x[lVar11],pDVar8,pDVar9);
                if (pDVar10 != (DdNode *)0x0) {
                  piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
                  *piVar1 = *piVar1 + 1;
                  Cudd_IterDerefBdd(dd,pDVar8);
                  Cudd_IterDerefBdd(dd,pDVar9);
                  if (iVar21 != iVar26 && iVar23 != iVar26) {
                    __assert_fail("newIndex[0] == invalidIndex || newIndex[1] == invalidIndex",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                  ,0x37a,
                                  "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                                 );
                  }
                  pDVar9 = pDVar10;
                  iVar24 = iVar4;
                  if (iVar23 != iVar26) {
                    pDVar9 = pDVar12;
                    pDVar14 = pDVar10;
                    iVar21 = iVar4;
                    iVar24 = iVar23;
                  }
                  goto LAB_00788f4d;
                }
                Cudd_IterDerefBdd(dd,pDVar8);
                Cudd_IterDerefBdd(dd,pDVar9);
                if (iVar19 != iVar26) {
                  Cudd_IterDerefBdd(dd,local_108);
                }
                if (iVar5 != iVar26) {
                  Cudd_IterDerefBdd(dd,local_f8);
                }
                if (iVar23 != iVar26) {
                  Cudd_IterDerefBdd(dd,pDVar12);
                }
                pDVar10 = (DdNode *)0x0;
              }
              pDVar12 = pDVar14;
              if (iVar21 == iVar26) goto LAB_00788fea;
              goto LAB_00788fd7;
            }
LAB_00788f4d:
            iVar6 = iVar4 + 1;
            bVar22 = iVar18 <= iVar4;
            iVar15 = iVar15 + 2;
            pDVar12 = pDVar9;
            iVar4 = iVar6;
            iVar23 = iVar24;
          } while (iVar17 + uVar20 + 1 != iVar6);
        }
        if (iVar19 != iVar26) {
          Cudd_IterDerefBdd(dd,local_108);
        }
        bVar30 = iVar5 != iVar26;
        pDVar12 = local_f8;
        local_108 = pDVar9;
        local_f8 = pDVar14;
        iVar5 = iVar21;
        iVar19 = iVar24;
        if (bVar30) {
LAB_00788fd7:
          Cudd_IterDerefBdd(dd,pDVar12);
        }
LAB_00788fea:
        if (!bVar22) goto LAB_00789124;
        iVar25 = iVar17 + (uint)bVar29 + 1;
        uVar16 = uVar16 * 2 + 1;
        local_110 = iVar13 + -1;
        uVar27 = uVar27 + 1;
      } while (uVar27 != N + 1);
      piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
    }
  }
  return pDVar10;
}

Assistant:

DdNode *
Cudd_Inequality(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  int c /* right-hand side constant */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    /* The nodes at level i represent values of the difference that are
    ** multiples of 2^i.  We use variables with names starting with k
    ** to denote the multipliers of 2^i in such multiples. */
    int kTrue = c;
    int kFalse = c - 1;
    /* Mask used to compute the ceiling function.  Since we divide by 2^i,
    ** we want to know whether the dividend is a multiple of 2^i.  If it is,
    ** then ceiling and floor coincide; otherwise, they differ by one. */
    int mask = 1;
    int i;

    DdNode *f = NULL;           /* the eventual result */
    DdNode *one = DD_ONE(dd);
    DdNode *zero = Cudd_Not(one);

    /* Two x-labeled nodes are created at most at each iteration.  They are
    ** stored, along with their k values, in these variables.  At each level,
    ** the old nodes are freed and the new nodes are copied into the old map.
    */
    DdNode *map[2] = {0};
    int invalidIndex = 1 << (N-1);
    int index[2] = {invalidIndex, invalidIndex};

    /* This should never happen. */
    if (N < 0) return(NULL);

    /* If there are no bits, both operands are 0.  The result depends on c. */
    if (N == 0) {
        if (c >= 0) return(one);
        else return(zero);
    }

    /* The maximum or the minimum difference comparing to c can generate the terminal case */
    if ((1 << N) - 1 < c) return(zero);
    else if ((-(1 << N) + 1) >= c) return(one);

    /* Build the result bottom up. */
    for (i = 1; i <= N; i++) {
        int kTrueLower, kFalseLower;
        int leftChild, middleChild, rightChild;
        DdNode *g0, *g1, *fplus, *fequal, *fminus;
        int j;
        DdNode *newMap[2] = {NULL};
        int newIndex[2];

        kTrueLower = kTrue;
        kFalseLower = kFalse;
        /* kTrue = ceiling((c-1)/2^i) + 1 */
        kTrue = ((c-1) >> i) + ((c & mask) != 1) + 1;
        mask = (mask << 1) | 1;
        /* kFalse = floor(c/2^i) - 1 */
        kFalse = (c >> i) - 1;
        newIndex[0] = invalidIndex;
        newIndex[1] = invalidIndex;

        for (j = kFalse + 1; j < kTrue; j++) {
            /* Skip if node is not reachable from top of BDD. */
            if ((j >= (1 << (N - i))) || (j <= -(1 << (N -i)))) continue;

            /* Find f- */
            leftChild = (j << 1) - 1;
            if (leftChild >= kTrueLower) {
                fminus = one;
            } else if (leftChild <= kFalseLower) {
                fminus = zero;
            } else {
                assert(leftChild == index[0] || leftChild == index[1]);
                if (leftChild == index[0]) {
                    fminus = map[0];
                } else {
                    fminus = map[1];
                }
            }

            /* Find f= */
            middleChild = j << 1;
            if (middleChild >= kTrueLower) {
                fequal = one;
            } else if (middleChild <= kFalseLower) {
                fequal = zero;
            } else {
                assert(middleChild == index[0] || middleChild == index[1]);
                if (middleChild == index[0]) {
                    fequal = map[0];
                } else {
                    fequal = map[1];
                }
            }

            /* Find f+ */
            rightChild = (j << 1) + 1;
            if (rightChild >= kTrueLower) {
                fplus = one;
            } else if (rightChild <= kFalseLower) {
                fplus = zero;
            } else {
                assert(rightChild == index[0] || rightChild == index[1]);
                if (rightChild == index[0]) {
                    fplus = map[0];
                } else {
                    fplus = map[1];
                }
            }

            /* Build new nodes. */
            g1 = Cudd_bddIte(dd, y[N - i], fequal, fplus);
            if (g1 == NULL) {
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g1);
            g0 = Cudd_bddIte(dd, y[N - i], fminus, fequal);
            if (g0 == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g0);
            f = Cudd_bddIte(dd, x[N - i], g1, g0);
            if (f == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                Cudd_IterDerefBdd(dd, g0);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(f);
            Cudd_IterDerefBdd(dd, g1);
            Cudd_IterDerefBdd(dd, g0);

            /* Save newly computed node in map. */
            assert(newIndex[0] == invalidIndex || newIndex[1] == invalidIndex);
            if (newIndex[0] == invalidIndex) {
                newIndex[0] = j;
                newMap[0] = f;
            } else {
                newIndex[1] = j;
                newMap[1] = f;
            }
        }

        /* Copy new map to map. */
        if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
        if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
        map[0] = newMap[0];
        map[1] = newMap[1];
        index[0] = newIndex[0];
        index[1] = newIndex[1];
    }

    cuddDeref(f);
    return(f);

}